

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgmres.hpp
# Opt level: O1

void __thiscall Cgmres<Model>::F_func(Cgmres<Model> *this,double *ret,double *U,double *x,double t)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  long lVar4;
  undefined1 *puVar5;
  double *pdVar6;
  long lVar7;
  double *lmd;
  bool bVar8;
  double dVar9;
  double xtau [104];
  double dStack_6c0;
  double local_6b8 [4];
  double local_698 [96];
  double local_398;
  double local_390;
  double local_388;
  double dStack_380;
  double adStack_378 [4];
  double local_358 [92];
  undefined1 local_78 [32];
  double local_58;
  double local_50;
  double local_48;
  double dStack_40;
  
  if (ret != U) {
    dVar9 = exp(t * -0.5);
    local_6b8[0] = *x;
    local_6b8[1] = x[1];
    local_6b8[2] = x[2];
    local_6b8[3] = x[3];
    pdVar6 = local_698;
    dVar9 = ((1.0 - dVar9) * 0.5) / 25.0;
    auVar2._8_4_ = SUB84(dVar9,0);
    auVar2._0_8_ = dVar9;
    auVar2._12_4_ = (int)((ulong)dVar9 >> 0x20);
    lVar7 = 0;
    do {
      Model::dxdt(local_698 + lVar7 * 4,local_6b8 + lVar7 * 4,U + lVar7 * 3,this->ptau + lVar7 * 2);
      lVar4 = 0;
      dStack_6c0 = auVar2._8_8_;
      do {
        dVar1 = (pdVar6 + lVar4)[1];
        pdVar6[lVar4] = pdVar6[lVar4] * dVar9;
        (pdVar6 + lVar4)[1] = dVar1 * dStack_6c0;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        dVar3 = (pdVar6 + lVar4)[1];
        dVar1 = (pdVar6 + lVar4 + -4)[1];
        pdVar6[lVar4] = pdVar6[lVar4] + pdVar6[lVar4 + -4];
        (pdVar6 + lVar4)[1] = dVar3 + dVar1;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar7 = lVar7 + 1;
      pdVar6 = pdVar6 + 4;
    } while (lVar7 != 0x19);
    local_58 = (local_398 - this->ptau[0x32]) * 3.0;
    puVar5 = local_78;
    local_50 = local_390 - this->ptau[0x33];
    local_48 = local_388 * 0.0;
    dStack_40 = dStack_380 * 0.0;
    lVar7 = 0x18;
    do {
      Model::dHdx(adStack_378 + lVar7 * 4,local_6b8 + lVar7 * 4,U + lVar7 * 3,this->ptau + lVar7 * 2
                  ,local_358 + lVar7 * 4);
      lVar4 = 0;
      do {
        dVar1 = *(double *)((long)(puVar5 + lVar4 * 8) + 8);
        *(double *)(puVar5 + lVar4 * 8) = *(double *)(puVar5 + lVar4 * 8) * dVar9;
        *(double *)((long)(puVar5 + lVar4 * 8) + 8) = dVar1 * dStack_6c0;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      lVar4 = 0;
      do {
        dVar3 = *(double *)((long)(puVar5 + lVar4 * 8) + 8);
        dVar1 = *(double *)((long)(puVar5 + lVar4 * 8 + 0x20) + 8);
        *(double *)(puVar5 + lVar4 * 8) =
             *(double *)(puVar5 + lVar4 * 8) + *(double *)(puVar5 + lVar4 * 8 + 0x20);
        *(double *)((long)(puVar5 + lVar4 * 8) + 8) = dVar3 + dVar1;
        lVar4 = lVar4 + 2;
      } while (lVar4 != 4);
      puVar5 = puVar5 + -0x20;
      bVar8 = lVar7 != 0;
      lVar7 = lVar7 + -1;
    } while (bVar8);
    pdVar6 = local_6b8;
    lmd = local_358;
    lVar7 = 0;
    do {
      Model::dHdu(ret,pdVar6,U,(double *)((long)this->ptau + lVar7),lmd);
      lVar7 = lVar7 + 0x10;
      lmd = lmd + 4;
      pdVar6 = pdVar6 + 4;
      ret = ret + 3;
      U = U + 3;
    } while (lVar7 != 400);
    return;
  }
  printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n","F_func");
  exit(-1);
}

Assistant:

void F_func(double* ret, const double* U, const double* x, const double t) const {
    uint16_t idx_x, idx_u, idx_p;
    double dtau;
    double xtau[dim_x * (dv + 1)];
    double ltau[dim_x * (dv + 1)];

#ifdef DEBUG_MODE
    if (ret == U) {
      printf("%s pointer error ! (U_vec_tmp is overwritten due to the same address of ret)\n", __func__);
      exit(-1);
    }
#endif

    // Prediction horizon
    dtau = get_dtau(t);

    // State equation
    // x(0) = x
    // x(i + 1) = x(i) + dxdt(x(i), u(i), p(i)) * dtau
    mov(&xtau[0], x, dim_x);
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dxdt(&xtau[idx_x + dim_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p]);
      mul(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], dtau, dim_x);
      add(&xtau[idx_x + dim_x], &xtau[idx_x + dim_x], &xtau[idx_x], dim_x);
    }

    // Adjoint equation
    // lmd(N) = dPhidx(x(N), p(N))
    // lmd(i) = lmd(i + 1) + dHdx(x(i), u(i), p(i), lmd(i + 1)) * dtau
    Model::dPhidx(&ltau[dim_x * dv], &xtau[dim_x * dv], &ptau[dim_p * dv]);
    for (int16_t i = dv - 1; i >= 0; i--) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdx(&ltau[idx_x], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
      mul(&ltau[idx_x], &ltau[idx_x], dtau, dim_x);
      add(&ltau[idx_x], &ltau[idx_x], &ltau[idx_x + dim_x], dim_x);
    }

    // F(i) = dHdU(x(i), u(i), lmd(i + 1))
    for (uint16_t i = 0; i < dv; i++) {
      idx_x = dim_x * i;
      idx_u = dim_u * i;
      idx_p = dim_p * i;
      Model::dHdu(&ret[idx_u], &xtau[idx_x], &U[idx_u], &ptau[idx_p], &ltau[idx_x + dim_x]);
    }
  }